

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O2

int IDAAhermiteMalloc(IDAMem IDA_mem)

{
  IDAadjMemRec *pIVar1;
  IDAdtpntMemRec **ppIVar2;
  undefined8 *puVar3;
  N_Vector p_Var4;
  N_Vector *pp_Var5;
  long *__ptr;
  long lVar6;
  long lVar7;
  int iVar8;
  
  pIVar1 = IDA_mem->ida_adj_mem;
  p_Var4 = (N_Vector)N_VClone(IDA_mem->ida_tempv1);
  pIVar1->ia_yyTmp = p_Var4;
  iVar8 = 0;
  if (p_Var4 != (N_Vector)0x0) {
    p_Var4 = (N_Vector)N_VClone(IDA_mem->ida_tempv1);
    pIVar1->ia_ypTmp = p_Var4;
    if (p_Var4 != (N_Vector)0x0) {
      if (pIVar1->ia_storeSensi != 0) {
        pp_Var5 = (N_Vector *)N_VCloneVectorArray(IDA_mem->ida_Ns,IDA_mem->ida_tempv1);
        pIVar1->ia_yySTmp = pp_Var5;
        if (pp_Var5 == (N_Vector *)0x0) {
          N_VDestroy(pIVar1->ia_yyTmp);
          N_VDestroy(pIVar1->ia_ypTmp);
          return 0;
        }
        pp_Var5 = (N_Vector *)N_VCloneVectorArray(IDA_mem->ida_Ns,IDA_mem->ida_tempv1);
        pIVar1->ia_ypSTmp = pp_Var5;
        if (pp_Var5 == (N_Vector *)0x0) {
          N_VDestroy(pIVar1->ia_yyTmp);
          N_VDestroy(pIVar1->ia_ypTmp);
          N_VDestroyVectorArray(pIVar1->ia_yySTmp,IDA_mem->ida_Ns);
          return 0;
        }
      }
      ppIVar2 = pIVar1->dt_mem;
      iVar8 = 1;
      for (lVar7 = 0; lVar7 <= pIVar1->ia_nsteps; lVar7 = lVar7 + 1) {
        __ptr = (long *)malloc(0x20);
        if (__ptr == (long *)0x0) goto LAB_00117421;
        lVar6 = N_VClone(IDA_mem->ida_tempv1);
        *__ptr = lVar6;
        if (lVar6 == 0) {
LAB_00117419:
          free(__ptr);
LAB_00117421:
          N_VDestroy(pIVar1->ia_yyTmp);
          N_VDestroy(pIVar1->ia_ypTmp);
          if (pIVar1->ia_storeSensi != 0) {
            N_VDestroyVectorArray(pIVar1->ia_yySTmp,IDA_mem->ida_Ns);
            N_VDestroyVectorArray(pIVar1->ia_ypSTmp,IDA_mem->ida_Ns);
          }
          for (lVar6 = 0; lVar7 != lVar6; lVar6 = lVar6 + 1) {
            puVar3 = (undefined8 *)ppIVar2[lVar6]->content;
            N_VDestroy(*puVar3);
            N_VDestroy(puVar3[1]);
            if (pIVar1->ia_storeSensi != 0) {
              N_VDestroyVectorArray(puVar3[2],IDA_mem->ida_Ns);
              N_VDestroyVectorArray(puVar3[3],IDA_mem->ida_Ns);
            }
            free(ppIVar2[lVar6]->content);
            ppIVar2[lVar6]->content = (void *)0x0;
          }
          return 0;
        }
        lVar6 = N_VClone(IDA_mem->ida_tempv1);
        __ptr[1] = lVar6;
        if (lVar6 == 0) {
          lVar6 = *__ptr;
LAB_001173f2:
          N_VDestroy(lVar6);
          goto LAB_00117419;
        }
        if (pIVar1->ia_storeSensi != 0) {
          lVar6 = N_VCloneVectorArray(IDA_mem->ida_Ns,IDA_mem->ida_tempv1);
          __ptr[2] = lVar6;
          if (lVar6 == 0) {
            N_VDestroy(*__ptr);
            lVar6 = __ptr[1];
            goto LAB_001173f2;
          }
          lVar6 = N_VCloneVectorArray(IDA_mem->ida_Ns,IDA_mem->ida_tempv1);
          __ptr[3] = lVar6;
          if (lVar6 == 0) {
            N_VDestroy(*__ptr);
            N_VDestroy(__ptr[1]);
            N_VDestroyVectorArray(__ptr[2],IDA_mem->ida_Ns);
            goto LAB_00117419;
          }
        }
        ppIVar2[lVar7]->content = __ptr;
      }
    }
  }
  return iVar8;
}

Assistant:

static sunbooleantype IDAAhermiteMalloc(IDAMem IDA_mem)
{
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  IDAhermiteDataMem content;
  long int i, ii = 0;
  sunbooleantype allocOK;

  allocOK = SUNTRUE;

  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Allocate space for the vectors yyTmp and ypTmp. */
  IDAADJ_mem->ia_yyTmp = N_VClone(IDA_mem->ida_tempv1);
  if (IDAADJ_mem->ia_yyTmp == NULL) { return (SUNFALSE); }
  IDAADJ_mem->ia_ypTmp = N_VClone(IDA_mem->ida_tempv1);
  if (IDAADJ_mem->ia_ypTmp == NULL) { return (SUNFALSE); }

  /* Allocate space for sensitivities temporary vectors. */
  if (IDAADJ_mem->ia_storeSensi)
  {
    IDAADJ_mem->ia_yySTmp = N_VCloneVectorArray(IDA_mem->ida_Ns,
                                                IDA_mem->ida_tempv1);
    if (IDAADJ_mem->ia_yySTmp == NULL)
    {
      N_VDestroy(IDAADJ_mem->ia_yyTmp);
      N_VDestroy(IDAADJ_mem->ia_ypTmp);
      return (SUNFALSE);
    }

    IDAADJ_mem->ia_ypSTmp = N_VCloneVectorArray(IDA_mem->ida_Ns,
                                                IDA_mem->ida_tempv1);
    if (IDAADJ_mem->ia_ypSTmp == NULL)
    {
      N_VDestroy(IDAADJ_mem->ia_yyTmp);
      N_VDestroy(IDAADJ_mem->ia_ypTmp);
      N_VDestroyVectorArray(IDAADJ_mem->ia_yySTmp, IDA_mem->ida_Ns);
      return (SUNFALSE);
    }
  }

  /* Allocate space for the content field of the dt structures */

  dt_mem = IDAADJ_mem->dt_mem;

  for (i = 0; i <= IDAADJ_mem->ia_nsteps; i++)
  {
    content = NULL;
    content = (IDAhermiteDataMem)malloc(sizeof(struct IDAhermiteDataMemRec));
    if (content == NULL)
    {
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    content->y = N_VClone(IDA_mem->ida_tempv1);
    if (content->y == NULL)
    {
      free(content);
      content = NULL;
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    content->yd = N_VClone(IDA_mem->ida_tempv1);
    if (content->yd == NULL)
    {
      N_VDestroy(content->y);
      free(content);
      content = NULL;
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    if (IDAADJ_mem->ia_storeSensi)
    {
      content->yS = N_VCloneVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_tempv1);
      if (content->yS == NULL)
      {
        N_VDestroy(content->y);
        N_VDestroy(content->yd);
        free(content);
        content = NULL;
        ii      = i;
        allocOK = SUNFALSE;
        break;
      }

      content->ySd = N_VCloneVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_tempv1);
      if (content->ySd == NULL)
      {
        N_VDestroy(content->y);
        N_VDestroy(content->yd);
        N_VDestroyVectorArray(content->yS, IDA_mem->ida_Ns);
        free(content);
        content = NULL;
        ii      = i;
        allocOK = SUNFALSE;
        break;
      }
    }

    dt_mem[i]->content = content;
  }

  /* If an error occurred, deallocate and return */

  if (!allocOK)
  {
    N_VDestroy(IDAADJ_mem->ia_yyTmp);
    N_VDestroy(IDAADJ_mem->ia_ypTmp);

    if (IDAADJ_mem->ia_storeSensi)
    {
      N_VDestroyVectorArray(IDAADJ_mem->ia_yySTmp, IDA_mem->ida_Ns);
      N_VDestroyVectorArray(IDAADJ_mem->ia_ypSTmp, IDA_mem->ida_Ns);
    }

    for (i = 0; i < ii; i++)
    {
      content = (IDAhermiteDataMem)(dt_mem[i]->content);
      N_VDestroy(content->y);
      N_VDestroy(content->yd);

      if (IDAADJ_mem->ia_storeSensi)
      {
        N_VDestroyVectorArray(content->yS, IDA_mem->ida_Ns);
        N_VDestroyVectorArray(content->ySd, IDA_mem->ida_Ns);
      }

      free(dt_mem[i]->content);
      dt_mem[i]->content = NULL;
    }
  }

  return (allocOK);
}